

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O0

Abc_Cex_t * Llb_ManReachDeriveCex(Llb_Man_t *p)

{
  DdManager *pDVar1;
  DdManager *ddDestination;
  Vec_Ptr_t *p_00;
  int iVar2;
  int iVar3;
  int iVar4;
  char *string;
  Abc_Cex_t *p_01;
  DdNode *pDVar5;
  DdNode *n;
  int *Permute;
  DdNode *n_00;
  char *pValues;
  int nPiOffset;
  int RetValue;
  int v;
  int i;
  DdNode *bRing;
  DdNode *bTemp;
  DdNode *bOneCube;
  DdNode *bImage;
  DdNode *bState;
  Aig_Obj_t *pObj;
  Abc_Cex_t *pCex;
  Llb_Man_t *p_local;
  
  bImage = (DdNode *)0x0;
  iVar2 = Cudd_ReadSize(p->ddR);
  string = (char *)malloc((long)iVar2);
  iVar2 = Vec_PtrSize(p->vRings);
  if (iVar2 < 1) {
    __assert_fail("Vec_PtrSize(p->vRings) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                  ,0x1dc,"Abc_Cex_t *Llb_ManReachDeriveCex(Llb_Man_t *)");
  }
  p->dd->TimeStop = 0;
  p->ddR->TimeStop = 0;
  iVar2 = Saig_ManRegNum(p->pAig);
  iVar3 = Saig_ManPiNum(p->pAig);
  iVar4 = Vec_PtrSize(p->vRings);
  p_01 = Abc_CexAlloc(iVar2,iVar3,iVar4);
  iVar2 = Vec_PtrSize(p->vRings);
  p_01->iFrame = iVar2 + -1;
  p_01->iPo = -1;
  pDVar1 = p->ddR;
  pDVar5 = (DdNode *)Vec_PtrEntryLast(p->vRings);
  pDVar5 = Cudd_bddIntersect(pDVar1,pDVar5,p->ddR->bFunc);
  Cudd_Ref(pDVar5);
  iVar2 = Cudd_bddPickOneCube(p->ddR,pDVar5,string);
  Cudd_RecursiveDeref(p->ddR,pDVar5);
  if (iVar2 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                  ,0x1f2,"Abc_Cex_t *Llb_ManReachDeriveCex(Llb_Man_t *)");
  }
  iVar2 = Saig_ManRegNum(p->pAig);
  iVar3 = Saig_ManPiNum(p->pAig);
  iVar4 = Vec_PtrSize(p->vRings);
  pValues._0_4_ = iVar2 + iVar3 * (iVar4 + -1);
  for (RetValue = 0; iVar2 = Saig_ManPiNum(p->pAig), RetValue < iVar2; RetValue = RetValue + 1) {
    Vec_PtrEntry(p->pAig->vCis,RetValue);
    iVar2 = Saig_ManRegNum(p->pAig);
    if (string[iVar2 + RetValue] == '\x01') {
      Abc_InfoSetBit((uint *)(p_01 + 1),(int)pValues + RetValue);
    }
  }
  iVar2 = Vec_PtrSize(p->vRings);
  if (1 < iVar2) {
    bImage = Llb_CoreComputeCube(p->dd,p->vGlo2Ns,1,string);
    Cudd_Ref(bImage);
  }
  nPiOffset = Vec_PtrSize(p->vRings);
LAB_00ab0bdd:
  do {
    nPiOffset = nPiOffset + -1;
    if (nPiOffset < 0) goto LAB_00ab0f67;
    pDVar5 = (DdNode *)Vec_PtrEntry(p->vRings,nPiOffset);
    iVar2 = Vec_PtrSize(p->vRings);
  } while (nPiOffset == iVar2 + -1);
  n = Llb_ManComputeImage(p,bImage,1);
  if (n == (DdNode *)0x0) {
    __assert_fail("bImage != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                  ,0x208,"Abc_Cex_t *Llb_ManReachDeriveCex(Llb_Man_t *)");
  }
  Cudd_Ref(n);
  Cudd_RecursiveDeref(p->dd,bImage);
  pDVar1 = p->dd;
  ddDestination = p->ddR;
  Permute = Vec_IntArray(p->vCs2Glo);
  n_00 = Extra_TransferPermute(pDVar1,ddDestination,n,Permute);
  Cudd_Ref(n_00);
  Cudd_RecursiveDeref(p->dd,n);
  pDVar5 = Cudd_bddIntersect(p->ddR,n_00,pDVar5);
  Cudd_Ref(pDVar5);
  Cudd_RecursiveDeref(p->ddR,n_00);
  iVar2 = Cudd_bddPickOneCube(p->ddR,pDVar5,string);
  Cudd_RecursiveDeref(p->ddR,pDVar5);
  if (iVar2 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                  ,0x219,"Abc_Cex_t *Llb_ManReachDeriveCex(Llb_Man_t *)");
  }
  iVar2 = Saig_ManPiNum(p->pAig);
  pValues._0_4_ = (int)pValues - iVar2;
  for (RetValue = 0; iVar2 = Saig_ManPiNum(p->pAig), RetValue < iVar2; RetValue = RetValue + 1) {
    Vec_PtrEntry(p->pAig->vCis,RetValue);
    iVar2 = Saig_ManRegNum(p->pAig);
    if (string[iVar2 + RetValue] == '\x01') {
      Abc_InfoSetBit((uint *)(p_01 + 1),(int)pValues + RetValue);
    }
  }
  if (nPiOffset != 0) {
    bImage = Llb_CoreComputeCube(p->dd,p->vGlo2Ns,1,string);
    Cudd_Ref(bImage);
    goto LAB_00ab0bdd;
  }
  for (RetValue = 0; iVar2 = Saig_ManRegNum(p->pAig), RetValue < iVar2; RetValue = RetValue + 1) {
    p_00 = p->pAig->vCis;
    iVar2 = Saig_ManPiNum(p->pAig);
    Vec_PtrEntry(p_00,RetValue + iVar2);
    if (string[RetValue] != '\0') {
      __assert_fail("pValues[i] == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                    ,0x229,"Abc_Cex_t *Llb_ManReachDeriveCex(Llb_Man_t *)");
    }
  }
LAB_00ab0f67:
  iVar2 = Saig_ManRegNum(p->pAig);
  if ((int)pValues != iVar2) {
    __assert_fail("nPiOffset == Saig_ManRegNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                  ,0x230,"Abc_Cex_t *Llb_ManReachDeriveCex(Llb_Man_t *)");
  }
  iVar2 = Saig_ManFindFailedPoCex(p->pAigGlo,p_01);
  if ((-1 < iVar2) && (iVar3 = Saig_ManPoNum(p->pAigGlo), iVar2 < iVar3)) {
    p_01->iPo = iVar2;
    if (string != (char *)0x0) {
      free(string);
    }
    return p_01;
  }
  __assert_fail("RetValue >= 0 && RetValue < Saig_ManPoNum(p->pAigGlo)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                ,0x234,"Abc_Cex_t *Llb_ManReachDeriveCex(Llb_Man_t *)");
}

Assistant:

Abc_Cex_t * Llb_ManReachDeriveCex( Llb_Man_t * p )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj;
    DdNode * bState = NULL, * bImage, * bOneCube, * bTemp, * bRing;
    int i, v, RetValue, nPiOffset;
    char * pValues = ABC_ALLOC( char, Cudd_ReadSize(p->ddR) );
    assert( Vec_PtrSize(p->vRings) > 0 );

    p->dd->TimeStop  = 0;
    p->ddR->TimeStop = 0;

/*
    Saig_ManForEachLo( p->pAig, pObj, i )
        printf( "%d ", pObj->Id );
    printf( "\n" );
    Saig_ManForEachLi( p->pAig, pObj, i )
        printf( "%d(%d) ", pObj->Id, Aig_ObjFaninId0(pObj) );
    printf( "\n" );
*/
    // allocate room for the counter-example
    pCex = Abc_CexAlloc( Saig_ManRegNum(p->pAig), Saig_ManPiNum(p->pAig), Vec_PtrSize(p->vRings) );
    pCex->iFrame = Vec_PtrSize(p->vRings) - 1;
    pCex->iPo = -1;

    // get the last cube
    bOneCube = Cudd_bddIntersect( p->ddR, (DdNode *)Vec_PtrEntryLast(p->vRings), p->ddR->bFunc );  Cudd_Ref( bOneCube );
    RetValue = Cudd_bddPickOneCube( p->ddR, bOneCube, pValues );
    Cudd_RecursiveDeref( p->ddR, bOneCube );
    assert( RetValue );

    // write PIs of counter-example
    nPiOffset = Saig_ManRegNum(p->pAig) + Saig_ManPiNum(p->pAig) * (Vec_PtrSize(p->vRings) - 1);
    Saig_ManForEachPi( p->pAig, pObj, i )
        if ( pValues[Saig_ManRegNum(p->pAig)+i] == 1 )
            Abc_InfoSetBit( pCex->pData, nPiOffset + i );

    // write state in terms of NS variables
    if ( Vec_PtrSize(p->vRings) > 1 )
    {
        bState = Llb_CoreComputeCube( p->dd, p->vGlo2Ns, 1, pValues );   Cudd_Ref( bState );
    }
    // perform backward analysis
    Vec_PtrForEachEntryReverse( DdNode *, p->vRings, bRing, v )
    { 
        if ( v == Vec_PtrSize(p->vRings) - 1 )
            continue;
//Extra_bddPrintSupport( p->dd, bState );  printf( "\n" );
//Extra_bddPrintSupport( p->dd, bRing );   printf( "\n" );
        // compute the next states
        bImage = Llb_ManComputeImage( p, bState, 1 ); 
        assert( bImage != NULL );
        Cudd_Ref( bImage );
        Cudd_RecursiveDeref( p->dd, bState );
//Extra_bddPrintSupport( p->dd, bImage );  printf( "\n" );

        // move reached states into ring manager
        bImage = Extra_TransferPermute( p->dd, p->ddR, bTemp = bImage, Vec_IntArray(p->vCs2Glo) );    Cudd_Ref( bImage );
        Cudd_RecursiveDeref( p->dd, bTemp );
//Extra_bddPrintSupport( p->ddR, bImage );  printf( "\n" );

        // intersect with the previous set
        bOneCube = Cudd_bddIntersect( p->ddR, bImage, bRing );                Cudd_Ref( bOneCube );
        Cudd_RecursiveDeref( p->ddR, bImage );

        // find any assignment of the BDD
        RetValue = Cudd_bddPickOneCube( p->ddR, bOneCube, pValues );
        Cudd_RecursiveDeref( p->ddR, bOneCube );
        assert( RetValue );
/*
        for ( i = 0; i < p->ddR->size; i++ )
            printf( "%d ", pValues[i] );
        printf( "\n" );
*/
        // write PIs of counter-example
        nPiOffset -= Saig_ManPiNum(p->pAig);
        Saig_ManForEachPi( p->pAig, pObj, i )
            if ( pValues[Saig_ManRegNum(p->pAig)+i] == 1 )
                Abc_InfoSetBit( pCex->pData, nPiOffset + i );

        // check that we get the init state
        if ( v == 0 )
        {
            Saig_ManForEachLo( p->pAig, pObj, i )
                assert( pValues[i] == 0 );
            break;
        }

        // write state in terms of NS variables
        bState = Llb_CoreComputeCube( p->dd, p->vGlo2Ns, 1, pValues );   Cudd_Ref( bState );
    }
    assert( nPiOffset == Saig_ManRegNum(p->pAig) );
    // update the output number
//Abc_CexPrint( pCex );
    RetValue = Saig_ManFindFailedPoCex( p->pAigGlo, pCex );
    assert( RetValue >= 0 && RetValue < Saig_ManPoNum(p->pAigGlo) ); // invalid CEX!!!
    pCex->iPo = RetValue;
    // cleanup
    ABC_FREE( pValues );
    return pCex;
}